

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlChar * xmlDictExists(xmlDictPtr dict,xmlChar *name,int len)

{
  xmlChar *pxVar1;
  _xmlDict *p_Var2;
  _xmlDictEntry *p_Var3;
  int iVar4;
  size_t sVar5;
  unsigned_long uVar6;
  uint uVar7;
  ulong uVar8;
  _xmlDictEntry *p_Var9;
  _xmlDictEntry *p_Var10;
  ulong uVar11;
  uint namelen;
  
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    sVar5 = (size_t)(uint)len;
    if (len < 0) {
      sVar5 = strlen((char *)name);
    }
    namelen = (uint)sVar5;
    if (dict->limit == 0) {
      if (0x3fffffff < namelen) {
        return (xmlChar *)0x0;
      }
    }
    else if (0x3fffffff < namelen || dict->limit <= (sVar5 & 0xffffffff)) {
      return (xmlChar *)0x0;
    }
    uVar11 = dict->size;
    if (uVar11 == 0x80) {
      uVar6 = xmlDictComputeFastKey(name,namelen,dict->seed);
    }
    else if (namelen == 0) {
      uVar6 = 0;
    }
    else {
      uVar7 = dict->seed;
      uVar8 = 0;
      do {
        uVar7 = (name[uVar8] + uVar7) * 0x401;
        uVar7 = uVar7 >> 6 ^ uVar7;
        uVar8 = uVar8 + 1;
      } while ((sVar5 & 0xffffffff) != uVar8);
      uVar6 = (unsigned_long)((uVar7 * 9 >> 0xb ^ uVar7 * 9) * 0x8001);
    }
    if (dict->dict[uVar6 % uVar11].valid != 0) {
      p_Var10 = dict->dict + uVar6 % uVar11;
      if (p_Var10->next != (_xmlDictEntry *)0x0) {
        p_Var3 = p_Var10->next;
        p_Var9 = p_Var10;
        do {
          p_Var10 = p_Var3;
          if ((p_Var9->okey == uVar6) && (p_Var9->len == namelen)) {
            pxVar1 = p_Var9->name;
            iVar4 = bcmp(pxVar1,name,sVar5 & 0xffffffff);
            if (iVar4 == 0) {
              return pxVar1;
            }
          }
          p_Var3 = p_Var10->next;
          p_Var9 = p_Var10;
        } while (p_Var10->next != (_xmlDictEntry *)0x0);
      }
      if ((p_Var10->okey == uVar6) && (p_Var10->len == namelen)) {
        pxVar1 = p_Var10->name;
        iVar4 = bcmp(pxVar1,name,sVar5 & 0xffffffff);
        if (iVar4 == 0) {
          return pxVar1;
        }
      }
    }
    p_Var2 = dict->subdict;
    if (p_Var2 != (_xmlDict *)0x0) {
      uVar8 = p_Var2->size;
      if (uVar11 == 0x80) {
        uVar11 = 0x80;
        if (uVar8 != 0x80) {
          if ((int)namelen < 1) {
            uVar6 = 0;
            uVar11 = uVar8;
          }
          else {
            uVar7 = p_Var2->seed;
            uVar11 = 0;
            do {
              uVar7 = (name[uVar11] + uVar7) * 0x401;
              uVar7 = uVar7 >> 6 ^ uVar7;
              uVar11 = uVar11 + 1;
            } while ((sVar5 & 0xffffffff) != uVar11);
            uVar6 = (unsigned_long)((uVar7 * 9 >> 0xb ^ uVar7 * 9) * 0x8001);
            uVar11 = uVar8;
          }
        }
      }
      else {
        uVar11 = uVar8;
        if (uVar8 == 0x80) {
          uVar6 = xmlDictComputeFastKey(name,namelen,p_Var2->seed);
          uVar11 = 0x80;
        }
      }
      if (p_Var2->dict[uVar6 % uVar11].valid != 0) {
        p_Var10 = p_Var2->dict + uVar6 % uVar11;
        if (p_Var10->next != (_xmlDictEntry *)0x0) {
          p_Var3 = p_Var10->next;
          p_Var9 = p_Var10;
          do {
            p_Var10 = p_Var3;
            if ((p_Var9->okey == uVar6) && (p_Var9->len == namelen)) {
              pxVar1 = p_Var9->name;
              iVar4 = bcmp(pxVar1,name,sVar5 & 0xffffffff);
              if (iVar4 == 0) {
                return pxVar1;
              }
            }
            p_Var3 = p_Var10->next;
            p_Var9 = p_Var10;
          } while (p_Var10->next != (_xmlDictEntry *)0x0);
        }
        if ((p_Var10->okey == uVar6) && (p_Var10->len == namelen)) {
          pxVar1 = p_Var10->name;
          iVar4 = bcmp(pxVar1,name,sVar5 & 0xffffffff);
          if (iVar4 == 0) {
            return pxVar1;
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictExists(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey;
    xmlDictEntryPtr insert;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;
    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
    }

    /* not found */
    return(NULL);
}